

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::insert(Board *this,Block block,int idToInsert)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  if (idToInsert == -1) {
    idToInsert = block.id;
  }
  bVar4 = Block::isHorizontal(&block);
  auVar3 = _DAT_0010c460;
  auVar2 = _DAT_0010c450;
  auVar1 = _DAT_0010c440;
  if (bVar4) {
    if (0 < block.length) {
      lVar7 = (long)block.column;
      lVar9 = (long)block.row;
      lVar6 = lVar7 + 1;
      if (lVar7 + 1 < (long)(block.length + block.column)) {
        lVar6 = (long)(block.length + block.column);
      }
      lVar5 = (lVar6 - lVar7) + -1;
      auVar11._8_4_ = (int)lVar5;
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar8 = 0;
      auVar11 = auVar11 ^ _DAT_0010c460;
      do {
        auVar13._8_4_ = (int)uVar8;
        auVar13._0_8_ = uVar8;
        auVar13._12_4_ = (int)(uVar8 >> 0x20);
        auVar15 = (auVar13 | auVar2) ^ auVar3;
        iVar12 = auVar11._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                    iVar12 < auVar15._4_4_) & 1)) {
          this->cells[lVar9][lVar7 + uVar8] = idToInsert;
        }
        if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
            auVar15._12_4_ <= auVar11._12_4_) {
          this->cells[lVar9][lVar7 + uVar8 + 1] = idToInsert;
        }
        auVar15 = (auVar13 | auVar1) ^ auVar3;
        iVar16 = auVar15._4_4_;
        if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
          this->cells[lVar9][lVar7 + uVar8 + 2] = idToInsert;
          this->cells[lVar9][lVar7 + uVar8 + 3] = idToInsert;
        }
        uVar8 = uVar8 + 4;
      } while (((lVar6 - lVar7) + 3U & 0xfffffffffffffffc) != uVar8);
    }
  }
  else if (0 < block.length) {
    lVar7 = (long)block.row;
    lVar6 = lVar7 + -1;
    if ((long)(block.row - block.length) < lVar7 + -1) {
      lVar6 = (long)(block.row - block.length);
    }
    lVar9 = (lVar7 - lVar6) + -1;
    auVar15._8_4_ = (int)lVar9;
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
    piVar10 = this->cells[lVar7] + block.column;
    uVar8 = 0;
    auVar15 = auVar15 ^ _DAT_0010c460;
    do {
      auVar14._8_4_ = (int)uVar8;
      auVar14._0_8_ = uVar8;
      auVar14._12_4_ = (int)(uVar8 >> 0x20);
      auVar11 = (auVar14 | auVar2) ^ auVar3;
      iVar12 = auVar15._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar12 && auVar15._0_4_ < auVar11._0_4_ ||
                  iVar12 < auVar11._4_4_) & 1)) {
        *piVar10 = idToInsert;
      }
      if ((auVar11._12_4_ != auVar15._12_4_ || auVar11._8_4_ <= auVar15._8_4_) &&
          auVar11._12_4_ <= auVar15._12_4_) {
        piVar10[-6] = idToInsert;
      }
      auVar14 = (auVar14 | auVar1) ^ auVar3;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar14._0_4_ <= auVar15._0_4_)) {
        piVar10[-0xc] = idToInsert;
        piVar10[-0x12] = idToInsert;
      }
      uVar8 = uVar8 + 4;
      piVar10 = piVar10 + -0x18;
    } while (((lVar7 - lVar6) + 3U & 0xfffffffffffffffc) != uVar8);
  }
  return;
}

Assistant:

void Board::insert(Block block, int idToInsert) {

    // If the ID is not specified, use the block's id.
    if (idToInsert == -1) {
        idToInsert = block.id;
    }

    // Insert the values into the 2D board array with IDs for move checks and visualization.
    if (block.isHorizontal()) {
        for (int i = block.column; i < block.column + block.length; ++i) {
            this->cells[block.row][i] = idToInsert;
        }
    } else {
        for (int i = block.row; i > block.row - block.length; --i) {
            this->cells[i][block.column] = idToInsert;
        }
    }
}